

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# queue.h
# Opt level: O0

void __thiscall CP::queue<int>::print(queue<int> *this)

{
  ostream *poVar1;
  ulong local_18;
  size_t i;
  queue<int> *this_local;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Size ");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,this->mSize);
  std::operator<<(poVar1,": ");
  for (local_18 = 0; local_18 < this->mSize; local_18 = local_18 + 1) {
    poVar1 = (ostream *)
             std::ostream::operator<<
                       ((ostream *)&std::cout,this->mData[(this->mFront + local_18) % this->mCap]);
    std::operator<<(poVar1," ");
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void print() {
      std::cout << "Size " << mSize << ": ";
      for (size_t i = 0;i < mSize;i++) {
        std::cout << mData[(mFront+i) % mCap] << " ";
      }
      std::cout << std::endl;
    }